

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v11::detail::format_dragon
               (basic_fp<unsigned___int128> value,uint flags,int num_digits,buffer<char> *buf,
               int *exp10)

{
  char *pcVar1;
  undefined1 n [16];
  undefined1 n_00 [16];
  undefined1 value_00 [16];
  int *piVar2;
  buffer<char> *this;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int i;
  bigint *this_00;
  long lVar7;
  undefined3 uStack_308;
  char digit;
  int num_digits_local;
  uint local_300;
  undefined4 uStack_2fc;
  int local_2f4;
  ulong local_2f0;
  bigint *local_2e8;
  int *local_2e0;
  buffer<char> *local_2d8;
  bigint numerator;
  bigint denominator;
  bigint lower;
  bigint upper_store;
  
  numerator.bigits_.super_buffer<unsigned_int>.size_ = 0;
  numerator.bigits_.super_buffer<unsigned_int>.grow_ =
       basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::grow;
  numerator.bigits_.super_buffer<unsigned_int>.ptr_ = numerator.bigits_.store_;
  numerator.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  numerator.exp_ = 0;
  denominator.bigits_.super_buffer<unsigned_int>.size_ = 0;
  denominator.bigits_.super_buffer<unsigned_int>.grow_ =
       basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::grow;
  denominator.bigits_.super_buffer<unsigned_int>.ptr_ = denominator.bigits_.store_;
  denominator.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  denominator.exp_ = 0;
  local_2e8 = &lower;
  lower.bigits_.super_buffer<unsigned_int>.size_ = 0;
  lower.bigits_.super_buffer<unsigned_int>.grow_ =
       basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::grow;
  lower.bigits_.super_buffer<unsigned_int>.ptr_ = lower.bigits_.store_;
  lower.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  lower.exp_ = 0;
  this_00 = &upper_store;
  upper_store.bigits_.super_buffer<unsigned_int>.size_ = 0;
  upper_store.bigits_.super_buffer<unsigned_int>.grow_ =
       basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::grow;
  upper_store.bigits_.super_buffer<unsigned_int>.ptr_ = upper_store.bigits_.store_;
  upper_store.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  upper_store.exp_ = 0;
  iVar6 = (flags & 1) + 1;
  num_digits_local = num_digits;
  local_300 = flags;
  if (value.e < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10(&numerator,-*exp10);
      bigint::assign(&lower,&numerator);
      if ((local_300 & 1) == 0) {
        this_00 = (bigint *)0x0;
      }
      else {
        this_00 = &upper_store;
        bigint::assign(this_00,&numerator);
        bigint::operator<<=(this_00,1);
      }
      value_00._4_4_ = num_digits_local;
      value_00._0_4_ = _uStack_308;
      value_00._8_4_ = local_300;
      value_00._12_4_ = uStack_2fc;
      bigint::multiply<unsigned___int128,_0>(&numerator,(unsigned___int128)value_00);
      bigint::operator<<=(&numerator,iVar6);
      bigint::assign<unsigned_long,_0>(&denominator,1);
      bigint::operator<<=(&denominator,iVar6 - value.e);
    }
    else {
      n_00._4_4_ = num_digits;
      n_00._0_4_ = _uStack_308;
      n_00._8_4_ = flags;
      n_00._12_4_ = uStack_2fc;
      bigint::assign<unsigned___int128,_0>(&numerator,(unsigned___int128)n_00);
      bigint::operator<<=(&numerator,iVar6);
      bigint::assign_pow10(&denominator,*exp10);
      bigint::operator<<=(&denominator,iVar6 - value.e);
      bigint::assign<unsigned_long,_0>(&lower,1);
      if ((local_300 & 1) == 0) {
        this_00 = (bigint *)0x0;
      }
      else {
        bigint::assign<unsigned_long,_0>(this_00,2);
      }
    }
  }
  else {
    n._4_4_ = num_digits;
    n._0_4_ = _uStack_308;
    n._8_4_ = flags;
    n._12_4_ = uStack_2fc;
    bigint::assign<unsigned___int128,_0>(&numerator,(unsigned___int128)n);
    bigint::operator<<=(&numerator,iVar6 + value.e);
    bigint::assign<unsigned_long,_0>(&lower,1);
    bigint::operator<<=(&lower,value.e);
    if ((local_300 & 1) == 0) {
      this_00 = (bigint *)0x0;
    }
    else {
      this_00 = &upper_store;
      bigint::assign<unsigned_long,_0>(this_00,1);
      bigint::operator<<=(this_00,value.e + 1);
    }
    bigint::assign_pow10(&denominator,*exp10);
    bigint::operator<<=(&denominator,iVar6);
  }
  iVar6 = num_digits_local;
  local_2f0 = (ulong)(~(uint)value.f & 1);
  if (this_00 != (bigint *)0x0) {
    local_2e8 = this_00;
  }
  if ((local_300 & 2) != 0) {
    iVar3 = add_compare(&numerator,local_2e8,&denominator);
    if (iVar3 + (int)local_2f0 == 0 || SCARRY4(iVar3,(int)local_2f0) != iVar3 + (int)local_2f0 < 0)
    {
      *exp10 = *exp10 + -1;
      bigint::multiply(&numerator,10);
      if (num_digits_local < 0) {
        bigint::multiply(&lower,10);
        if (this_00 != (bigint *)0x0) {
          bigint::multiply(this_00,10);
        }
      }
    }
    if ((local_300 & 4) != 0) {
      adjust_precision(&num_digits_local,*exp10 + 1);
    }
  }
  if (-1 < iVar6) {
    *exp10 = (*exp10 - num_digits_local) + 1;
    if ((long)num_digits_local < 1) {
      _uStack_308 = CONCAT13(0x30,uStack_308);
      if (num_digits_local == 0) {
        bigint::multiply(&denominator,10);
        iVar6 = add_compare(&numerator,&numerator,&denominator);
        _uStack_308 = CONCAT13(0 < iVar6,uStack_308) | 0x30000000;
      }
      buffer<char>::push_back(buf,&digit);
    }
    else {
      buffer<char>::try_resize(buf,(long)num_digits_local);
      for (lVar7 = 0; lVar7 < (long)num_digits_local + -1; lVar7 = lVar7 + 1) {
        iVar6 = bigint::divmod_assign(&numerator,&denominator);
        buf->ptr_[lVar7] = (char)iVar6 + '0';
        bigint::multiply(&numerator,10);
      }
      uVar4 = bigint::divmod_assign(&numerator,&denominator);
      iVar6 = add_compare(&numerator,&numerator,&denominator);
      if ((0 < iVar6) || ((uVar4 & 1) != 0 && iVar6 == 0)) {
        if (uVar4 == 9) {
          buf->ptr_[(long)num_digits_local + -1] = ':';
          for (uVar5 = (ulong)(uint)num_digits_local;
              (pcVar1 = buf->ptr_, 1 < (int)uVar5 && (pcVar1[uVar5 - 1] == ':')); uVar5 = uVar5 - 1)
          {
            pcVar1[uVar5 - 1] = '0';
            buf->ptr_[uVar5 - 2] = buf->ptr_[uVar5 - 2] + '\x01';
          }
          if (*pcVar1 == ':') {
            *pcVar1 = '1';
            if ((local_300 & 4) == 0) {
              *exp10 = *exp10 + 1;
            }
            else {
              _uStack_308 = CONCAT13(0x30,uStack_308);
              buffer<char>::push_back(buf,&digit);
            }
          }
          goto LAB_003f98fc;
        }
        uVar4 = uVar4 + 1;
      }
      buf->ptr_[(long)num_digits_local + -1] = (char)uVar4 + '0';
    }
    goto LAB_003f98fc;
  }
  num_digits_local = 0;
  local_300 = (uint)buf->ptr_;
  uStack_2fc = (undefined4)((ulong)buf->ptr_ >> 0x20);
  local_2f4 = -(int)local_2f0;
  local_2e0 = exp10;
  local_2d8 = buf;
  while( true ) {
    uVar4 = bigint::divmod_assign(&numerator,&denominator);
    iVar6 = compare(&numerator,&lower);
    iVar3 = add_compare(&numerator,local_2e8,&denominator);
    this = local_2d8;
    piVar2 = local_2e0;
    lVar7 = (long)num_digits_local;
    num_digits_local = num_digits_local + 1;
    *(char *)(CONCAT44(uStack_2fc,local_300) + lVar7) = (char)uVar4 + '0';
    if ((iVar6 < (int)local_2f0) || (local_2f4 < iVar3)) break;
    bigint::multiply(&numerator,10);
    bigint::multiply(&lower,10);
    if (this_00 != (bigint *)0x0) {
      bigint::multiply(this_00,10);
    }
  }
  if (iVar6 < (int)local_2f0) {
    if (local_2f4 < iVar3) {
      iVar6 = add_compare(&numerator,&numerator,&denominator);
      if ((0 < iVar6) || ((uVar4 & 1) != 0 && iVar6 == 0)) goto LAB_003f979c;
    }
  }
  else {
LAB_003f979c:
    pcVar1 = (char *)(CONCAT44(uStack_2fc,local_300) + -1 + (long)num_digits_local);
    *pcVar1 = *pcVar1 + '\x01';
  }
  buffer<char>::try_resize(this,(ulong)(uint)num_digits_local);
  *piVar2 = (*piVar2 - num_digits_local) + 1;
LAB_003f98fc:
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::deallocate
            (&upper_store.bigits_);
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::deallocate
            (&lower.bigits_);
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::deallocate
            (&denominator.bigits_);
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::deallocate
            (&numerator.bigits_);
  return;
}

Assistant:

FMT_CONSTEXPR20 inline void format_dragon(basic_fp<uint128_t> value,
                                          unsigned flags, int num_digits,
                                          buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  bool is_predecessor_closer = (flags & dragon::predecessor_closer) != 0;
  int shift = is_predecessor_closer ? 2 : 1;
  if (value.e >= 0) {
    numerator = value.f;
    numerator <<= value.e + shift;
    lower = 1;
    lower <<= value.e;
    if (is_predecessor_closer) {
      upper_store = 1;
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (is_predecessor_closer) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= value.f;
    numerator <<= shift;
    denominator = 1;
    denominator <<= shift - value.e;
  } else {
    numerator = value.f;
    numerator <<= shift;
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower = 1;
    if (is_predecessor_closer) {
      upper_store = 1ULL << 1;
      upper = &upper_store;
    }
  }
  int even = static_cast<int>((value.f & 1) == 0);
  if (!upper) upper = &lower;
  bool shortest = num_digits < 0;
  if ((flags & dragon::fixup) != 0) {
    if (add_compare(numerator, *upper, denominator) + even <= 0) {
      --exp10;
      numerator *= 10;
      if (num_digits < 0) {
        lower *= 10;
        if (upper != &lower) *upper *= 10;
      }
    }
    if ((flags & dragon::fixed) != 0) adjust_precision(num_digits, exp10 + 1);
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (shortest) {
    // Generate the shortest representation.
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits <= 0) {
    auto digit = '0';
    if (num_digits == 0) {
      denominator *= 10;
      digit = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    }
    buf.push_back(digit);
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        if ((flags & dragon::fixed) != 0)
          buf.push_back('0');
        else
          ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}